

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O0

uint __thiscall jpgd::jpeg_decoder::get_bits_no_markers(jpeg_decoder *this,int num_bits)

{
  uint8 uVar1;
  uint8 uVar2;
  int iVar3;
  int in_ESI;
  long in_RDI;
  uint c2;
  uint c1;
  uint i;
  undefined4 local_4;
  
  if (in_ESI == 0) {
    local_4 = 0;
  }
  else {
    local_4 = *(uint *)(in_RDI + 0x24c0) >> (0x20 - (byte)in_ESI & 0x1f);
    iVar3 = *(int *)(in_RDI + 0x24bc) - in_ESI;
    *(int *)(in_RDI + 0x24bc) = iVar3;
    if (iVar3 < 1) {
      iVar3 = *(int *)(in_RDI + 0x24bc) + in_ESI;
      *(int *)(in_RDI + 0x24c0) = *(int *)(in_RDI + 0x24c0) << ((byte)iVar3 & 0x1f);
      if (((*(int *)(in_RDI + 0x330) < 2) || (**(char **)(in_RDI + 0x328) == -1)) ||
         (*(char *)(*(long *)(in_RDI + 0x328) + 1) == -1)) {
        uVar1 = get_octet((jpeg_decoder *)CONCAT44(iVar3,local_4));
        uVar2 = get_octet((jpeg_decoder *)CONCAT44(iVar3,local_4));
        *(uint *)(in_RDI + 0x24c0) = (uint)CONCAT11(uVar1,uVar2) | *(uint *)(in_RDI + 0x24c0);
      }
      else {
        *(uint *)(in_RDI + 0x24c0) =
             (uint)CONCAT11(**(undefined1 **)(in_RDI + 0x328),
                            *(undefined1 *)(*(long *)(in_RDI + 0x328) + 1)) |
             *(uint *)(in_RDI + 0x24c0);
        *(int *)(in_RDI + 0x330) = *(int *)(in_RDI + 0x330) + -2;
        *(long *)(in_RDI + 0x328) = *(long *)(in_RDI + 0x328) + 2;
      }
      *(int *)(in_RDI + 0x24c0) =
           *(int *)(in_RDI + 0x24c0) << (-(char)*(undefined4 *)(in_RDI + 0x24bc) & 0x1fU);
      *(int *)(in_RDI + 0x24bc) = *(int *)(in_RDI + 0x24bc) + 0x10;
    }
    else {
      *(int *)(in_RDI + 0x24c0) = *(int *)(in_RDI + 0x24c0) << ((byte)in_ESI & 0x1f);
    }
  }
  return local_4;
}

Assistant:

inline uint jpeg_decoder::get_bits_no_markers(int num_bits) {
  if (!num_bits)
    return 0;

  uint i = m_bit_buf >> (32 - num_bits);

  if ((m_bits_left -= num_bits) <= 0) {
    m_bit_buf <<= (num_bits += m_bits_left);

    if ((m_in_buf_left < 2) || (m_pIn_buf_ofs[0] == 0xFF) || (m_pIn_buf_ofs[1] == 0xFF)) {
      uint c1 = get_octet();
      uint c2 = get_octet();
      m_bit_buf |= (c1 << 8) | c2;
    } else {
      m_bit_buf |= ((uint)m_pIn_buf_ofs[0] << 8) | m_pIn_buf_ofs[1];
      m_in_buf_left -= 2;
      m_pIn_buf_ofs += 2;
    }

    m_bit_buf <<= -m_bits_left;

    m_bits_left += 16;

    JPGD_ASSERT(m_bits_left >= 0);
  } else
    m_bit_buf <<= num_bits;

  return i;
}